

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O2

void tree_to_node(void *data,BLOCK_SIZE bsize,variance_node *node)

{
  int split_idx;
  long lVar1;
  VPartVar **ppVVar2;
  undefined3 in_register_00000031;
  VPartVar *pVVar3;
  
  node->part_variances = (VPVariance *)data;
  pVVar3 = (VPartVar *)((long)data + 0x50);
  ppVVar2 = node->split;
  switch(CONCAT31(in_register_00000031,bsize)) {
  case 6:
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      ppVVar2[lVar1] = pVVar3;
      pVVar3 = pVVar3 + 0x29;
    }
    break;
  case 9:
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      ppVVar2[lVar1] = pVVar3;
      pVVar3 = pVVar3 + 0xa9;
    }
    break;
  case 0xc:
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      ppVVar2[lVar1] = pVVar3;
      pVVar3 = pVVar3 + 0x2a9;
    }
    break;
  case 0xf:
    for (lVar1 = 0; lVar1 != 0x2aa40; lVar1 = lVar1 + 0xaa90) {
      *ppVVar2 = (VPartVar *)(*(long *)pVVar3 + lVar1);
      ppVVar2 = ppVVar2 + 1;
    }
    break;
  default:
    if (CONCAT31(in_register_00000031,bsize) == 3) {
      for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
        ppVVar2[lVar1] = pVVar3;
        pVVar3 = pVVar3 + 9;
      }
      return;
    }
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xd:
  case 0xe:
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      ppVVar2[lVar1] = pVVar3;
      pVVar3 = pVVar3 + 1;
    }
  }
  return;
}

Assistant:

static inline void tree_to_node(void *data, BLOCK_SIZE bsize,
                                variance_node *node) {
  node->part_variances = NULL;
  switch (bsize) {
    case BLOCK_128X128: {
      VP128x128 *vt = (VP128x128 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    case BLOCK_64X64: {
      VP64x64 *vt = (VP64x64 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    case BLOCK_32X32: {
      VP32x32 *vt = (VP32x32 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    case BLOCK_16X16: {
      VP16x16 *vt = (VP16x16 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    case BLOCK_8X8: {
      VP8x8 *vt = (VP8x8 *)data;
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx].part_variances.none;
      break;
    }
    default: {
      VP4x4 *vt = (VP4x4 *)data;
      assert(bsize == BLOCK_4X4);
      node->part_variances = &vt->part_variances;
      for (int split_idx = 0; split_idx < 4; split_idx++)
        node->split[split_idx] = &vt->split[split_idx];
      break;
    }
  }
}